

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::at<std::__cxx11::string>
          (Map<std::__cxx11::string,std::__cxx11::string> *this,
          key_arg<std::__cxx11::basic_string<char>_> *key)

{
  pointer pcVar1;
  ViewType k;
  string_view str;
  NodeAndBucket NVar2;
  LogMessage local_40;
  string local_30;
  
  k._M_str = (key->_M_dataplus)._M_p;
  k._M_len = key->_M_string_length;
  NVar2 = protobuf::internal::
          KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::FindHelper((KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this,k);
  if (NVar2.node != (NodeBase *)0x0) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(NVar2.node + 5);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x4e8,"it != end()");
  str._M_str = "key not found: ";
  str._M_len = 0xf;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_40,str);
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  pcVar1 = (key->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_30,pcVar1,pcVar1 + key->_M_string_length);
  absl::lts_20250127::log_internal::LogMessage::operator<<(&local_40,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }